

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

int __thiscall JetHead::File::munmap(File *this,void *__addr,size_t __len)

{
  int iVar1;
  int *piVar2;
  File *this_local;
  
  if (this->mMapAddress == (uint8_t *)0x0) {
    this_local._4_4_ = kInvalidRequest;
  }
  else {
    iVar1 = ::munmap(this->mMapAddress,this->mMapLength);
    if (iVar1 == 0) {
      this_local._4_4_ = kNoError;
    }
    else {
      piVar2 = __errno_location();
      this_local._4_4_ = getErrorCode(*piVar2);
    }
  }
  return this_local._4_4_;
}

Assistant:

JetHead::ErrCode	File::munmap()
{
	if ( mMapAddress != NULL )
	{
		if ( ::munmap( mMapAddress, mMapLength ) != 0 )
			return getErrorCode( errno );
	}
	else
	{
		return JetHead::kInvalidRequest;
	}

	return JetHead::kNoError;
}